

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::defaultCollisionHandler(btSoftBody *this,btCollisionObjectWrapper *pcoWrap)

{
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  btCollisionObject *pbVar4;
  btScalar bVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float fVar7;
  btDbvtVolume volume;
  CollideSDF_RS docollide;
  btVector3 maxs;
  btVector3 mins;
  btDbvtAabbMm box;
  btDbvtAabbMm local_d8;
  undefined1 local_b8 [12];
  btScalar bStack_ac;
  undefined8 uStack_a8;
  btScalar bStack_a0;
  undefined4 uStack_9c;
  float local_98;
  btVector3 local_88;
  btScalar local_78 [2];
  btScalar abStack_70 [2];
  undefined1 local_68 [56];
  
  uVar3 = (this->m_cfg).collisions & 0xf;
  if (uVar3 == 2) {
    local_b8._8_4_ = 1.0;
    bStack_ac = 0.0;
    uStack_a8._0_4_ = 0.0;
    uStack_a8._4_4_ = 0.0;
    bStack_a0 = 0.0;
    local_b8._0_8_ = &PTR__ICollide_001f2658;
    btSoftColliders::CollideCL_RS::ProcessColObj((CollideCL_RS *)local_b8,this,pcoWrap);
  }
  else if (uVar3 == 1) {
    local_b8._0_8_ = &PTR__ICollide_001f25f8;
    pbVar4 = (btCollisionObject *)0x0;
    if ((pcoWrap->m_collisionObject->m_internalType & 2) != 0) {
      pbVar4 = pcoWrap->m_collisionObject;
    }
    fVar1 = (pcoWrap->m_worldTransform->m_origin).m_floats[2];
    uVar2 = *(undefined8 *)(pcoWrap->m_worldTransform->m_origin).m_floats;
    fVar6 = (float)uVar2;
    fVar7 = (float)((ulong)uVar2 >> 0x20);
    local_d8.mi.m_floats[1] = fVar7 - fVar7;
    local_d8.mi.m_floats[0] = fVar6 - fVar6;
    local_d8.mi.m_floats[2] = fVar1 - fVar1;
    local_d8.mi.m_floats[3] = 0.0;
    bVar5 = btVector3::length(&local_d8.mi);
    (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
    (*pcoWrap->m_shape->_vptr_btCollisionShape[2])
              (pcoWrap->m_shape,pcoWrap->m_worldTransform,local_68,local_78);
    local_d8.mx.m_floats[0] = local_78[0];
    local_d8.mx.m_floats[1] = local_78[1];
    local_d8.mx.m_floats[2] = abStack_70[0];
    local_d8.mx.m_floats[3] = abStack_70[1];
    local_88.m_floats[3] = 0.0;
    btDbvtAabbMm::Expand(&local_d8,&local_88);
    bStack_a0 = SUB84(pbVar4,0);
    uStack_9c = (undefined4)((ulong)pbVar4 >> 0x20);
    local_98 = bVar5 + extraout_XMM0_Da;
    unique0x10000304 = this;
    uStack_a8 = pcoWrap;
    btDbvt::collideTV(&this->m_ndbvt,(this->m_ndbvt).m_root,&local_d8,(ICollide *)local_b8);
  }
  return;
}

Assistant:

void			btSoftBody::defaultCollisionHandler(const btCollisionObjectWrapper* pcoWrap)
{

	switch(m_cfg.collisions&fCollision::RVSmask)
	{
	case	fCollision::SDF_RS:
		{
			btSoftColliders::CollideSDF_RS	docollide;		
			btRigidBody*		prb1=(btRigidBody*) btRigidBody::upcast(pcoWrap->getCollisionObject());
			btTransform	wtr=pcoWrap->getWorldTransform();

			const btTransform	ctr=pcoWrap->getWorldTransform();
			const btScalar		timemargin=(wtr.getOrigin()-ctr.getOrigin()).length();
			const btScalar		basemargin=getCollisionShape()->getMargin();
			btVector3			mins;
			btVector3			maxs;
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume;
			pcoWrap->getCollisionShape()->getAabb(	pcoWrap->getWorldTransform(),
				mins,
				maxs);
			volume=btDbvtVolume::FromMM(mins,maxs);
			volume.Expand(btVector3(basemargin,basemargin,basemargin));		
			docollide.psb		=	this;
			docollide.m_colObj1Wrap = pcoWrap;
			docollide.m_rigidBody = prb1;

			docollide.dynmargin	=	basemargin+timemargin;
			docollide.stamargin	=	basemargin;
			m_ndbvt.collideTV(m_ndbvt.m_root,volume,docollide);
		}
		break;
	case	fCollision::CL_RS:
		{
			btSoftColliders::CollideCL_RS	collider;
			collider.ProcessColObj(this,pcoWrap);
		}
		break;
	}
}